

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::AudioTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               AudioTrack **pResult)

{
  int iVar1;
  long lVar2;
  AudioTrack *this;
  AudioTrack *local_b8;
  int status;
  AudioTrack *pTrack;
  long status_1;
  longlong size;
  longlong id;
  longlong bit_depth;
  longlong channels;
  double rate;
  longlong stop;
  longlong pos;
  Settings *s;
  IMkvReader *pReader;
  AudioTrack **pResult_local;
  longlong element_size_local;
  longlong element_start_local;
  Info *info_local;
  Segment *pSegment_local;
  
  if (*pResult == (AudioTrack *)0x0) {
    if (info->type == 2) {
      s = (Settings *)pSegment->m_pReader;
      pos = (longlong)&info->settings;
      pReader = (IMkvReader *)pResult;
      pResult_local = (AudioTrack **)element_size;
      element_size_local = element_start;
      element_start_local = (longlong)info;
      info_local = (Info *)pSegment;
      if (((Settings *)pos)->start < 0) {
        __assert_fail("s.start >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x15d5,
                      "static long mkvparser::AudioTrack::Parse(Segment *, const Info &, long long, long long, AudioTrack *&)"
                     );
      }
      if ((info->settings).size < 0) {
        __assert_fail("s.size >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x15d6,
                      "static long mkvparser::AudioTrack::Parse(Segment *, const Info &, long long, long long, AudioTrack *&)"
                     );
      }
      stop = ((Settings *)pos)->start;
      if (stop < 0) {
        __assert_fail("pos >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x15d9,
                      "static long mkvparser::AudioTrack::Parse(Segment *, const Info &, long long, long long, AudioTrack *&)"
                     );
      }
      rate = (double)(stop + (info->settings).size);
      channels = 0x40bf400000000000;
      bit_depth = 1;
      id = 0;
      do {
        if ((long)rate <= stop) {
          if ((double)stop != rate) {
            return -2;
          }
          this = (AudioTrack *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
          local_b8 = (AudioTrack *)0x0;
          if (this != (AudioTrack *)0x0) {
            AudioTrack(this,(Segment *)info_local,element_size_local,(longlong)pResult_local);
            local_b8 = this;
          }
          if (local_b8 == (AudioTrack *)0x0) {
            return -1;
          }
          iVar1 = Track::Info::Copy((Info *)element_start_local,&(local_b8->super_Track).m_info);
          if (iVar1 != 0) {
            if (local_b8 != (AudioTrack *)0x0) {
              (*(local_b8->super_Track)._vptr_Track[1])();
            }
            return (long)iVar1;
          }
          local_b8->m_rate = (double)channels;
          local_b8->m_channels = bit_depth;
          local_b8->m_bitDepth = id;
          pReader->_vptr_IMkvReader = (_func_int **)local_b8;
          return 0;
        }
        lVar2 = ParseElementHeader((IMkvReader *)s,&stop,(longlong)rate,&size,&status_1);
        if (lVar2 < 0) {
          return lVar2;
        }
        if (size == 0xb5) {
          lVar2 = UnserializeFloat((IMkvReader *)s,stop,status_1,(double *)&channels);
          if (lVar2 < 0) {
            return lVar2;
          }
          if ((double)channels <= 0.0) {
            return -2;
          }
        }
        else if (size == 0x9f) {
          bit_depth = UnserializeUInt((IMkvReader *)s,stop,status_1);
          if (bit_depth < 1) {
            return -2;
          }
        }
        else if ((size == 0x6264) && (id = UnserializeUInt((IMkvReader *)s,stop,status_1), id < 1))
        {
          return -2;
        }
        stop = status_1 + stop;
      } while (stop <= (long)rate);
      pSegment_local = (Segment *)0xfffffffffffffffe;
    }
    else {
      pSegment_local = (Segment *)0xffffffffffffffff;
    }
  }
  else {
    pSegment_local = (Segment *)0xffffffffffffffff;
  }
  return (long)pSegment_local;
}

Assistant:

long AudioTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       AudioTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kAudio)
    return -1;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  double rate = 8000.0;  // MKV default
  long long channels = 1;
  long long bit_depth = 0;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSamplingFrequency) {
      status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvChannels) {
      channels = UnserializeUInt(pReader, pos, size);

      if (channels <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvBitDepth) {
      bit_depth = UnserializeUInt(pReader, pos, size);

      if (bit_depth <= 0)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  AudioTrack* const pTrack =
      new (std::nothrow) AudioTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {
    delete pTrack;
    return status;
  }

  pTrack->m_rate = rate;
  pTrack->m_channels = channels;
  pTrack->m_bitDepth = bit_depth;

  pResult = pTrack;
  return 0;  // success
}